

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  int iVar1;
  uint uVar2;
  size_t code;
  ZSTD_cpuid_t cpuid;
  size_t err;
  ZSTD_CCtx *cctx_local;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2a8d,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
  }
  memset(cctx,0,0x488);
  (cctx->customMem).customAlloc = memManager.customAlloc;
  (cctx->customMem).customFree = memManager.customFree;
  (cctx->customMem).opaque = memManager.opaque;
  cpuid = ZSTD_cpuid();
  iVar1 = ZSTD_cpuid_bmi2(cpuid);
  cctx->bmi2 = iVar1;
  code = ZSTD_CCtx_reset(cctx,ZSTD_reset_parameters);
  uVar2 = ZSTD_isError(code);
  if (uVar2 != 0) {
    __assert_fail("!ZSTD_isError(err)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2a92,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
  }
  return;
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}